

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageDither(Image *image,int rBpp,int gBpp,int bBpp,int aBpp)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  byte bVar7;
  int iVar8;
  Color *__ptr;
  void *pvVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uchar uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  float fVar23;
  int local_84;
  
  if (((image->data == (void *)0x0) || (image->width == 0)) || (image->height == 0)) {
    return;
  }
  if (10 < image->format) {
    TraceLog(4,"IMAGE: Compressed data formats can not be dithered");
    return;
  }
  uVar14 = rBpp + gBpp + aBpp + bBpp;
  if (0x10 < (int)uVar14) {
    TraceLog(4,"IMAGE: Unsupported dithering bpps (%ibpp), only 16bpp or lower modes supported",
             (ulong)uVar14);
    return;
  }
  __ptr = LoadImageColors(*image);
  free(image->data);
  if ((image->format != 4) && (image->format != 7)) {
    TraceLog(4,"IMAGE: Format is already 16bpp or lower, dithering could have no effect");
  }
  if (((bBpp == 5) && (rBpp == 5)) && ((gBpp == 6 && (aBpp == 0)))) {
    image->format = 3;
  }
  else if ((((bBpp == 5) && (rBpp == 5)) && (gBpp == 5)) && (aBpp == 1)) {
    image->format = 5;
  }
  else if (aBpp == 4 && (bBpp == 4 && (gBpp == 4 && rBpp == 4))) {
    image->format = 6;
  }
  else {
    image->format = 0;
    TraceLog(4,"IMAGE: Unsupported dithered OpenGL internal format: %ibpp (R%iG%iB%iA%i)",
             (ulong)uVar14,(ulong)(uint)rBpp,(ulong)(uint)gBpp,(ulong)(uint)bBpp,aBpp);
  }
  iVar15 = image->width;
  iVar13 = image->height;
  pvVar9 = malloc((long)(iVar13 * iVar15) * 2);
  image->data = pvVar9;
  bVar10 = 8 - (char)rBpp;
  bVar11 = 8 - (char)gBpp;
  bVar12 = 8 - (char)bBpp;
  bVar7 = (byte)(aBpp + bBpp);
  local_84 = 1;
  iVar6 = 0;
  while (iVar6 < iVar13) {
    for (iVar13 = 0; iVar13 < iVar15; iVar13 = iVar13 + 1) {
      lVar21 = (long)(iVar6 * iVar15 + iVar13);
      bVar1 = __ptr[lVar21].r;
      bVar3 = bVar1 >> (bVar10 & 0x1f);
      bVar2 = __ptr[lVar21].g >> (bVar11 & 0x1f);
      bVar4 = __ptr[lVar21].b >> (bVar12 & 0x1f);
      bVar5 = __ptr[lVar21].a >> (8 - (byte)aBpp & 0x1f);
      iVar17 = (uint)__ptr[lVar21].g - ((uint)bVar2 << (bVar11 & 0x1f));
      iVar8 = (uint)__ptr[lVar21].b - ((uint)bVar4 << (bVar12 & 0x1f));
      __ptr[lVar21].r = bVar3;
      __ptr[lVar21].g = bVar2;
      fVar23 = (float)(int)((uint)bVar1 - ((uint)bVar3 << (bVar10 & 0x1f)));
      __ptr[lVar21].b = bVar4;
      __ptr[lVar21].a = bVar5;
      if (iVar13 < iVar15 + -1) {
        iVar18 = (int)(fVar23 * 7.0 * 0.0625) + (uint)__ptr[lVar21 + 1].r;
        if (0xfe < iVar18) {
          iVar18 = 0xff;
        }
        __ptr[lVar21 + 1].r = (uchar)iVar18;
        iVar18 = (int)((float)iVar17 * 7.0 * 0.0625) + (uint)__ptr[lVar21 + 1].g;
        uVar16 = (uchar)iVar18;
        if (0xfe < iVar18) {
          uVar16 = 0xff;
        }
        __ptr[lVar21 + 1].g = uVar16;
        iVar18 = (int)((float)iVar8 * 7.0 * 0.0625) + (uint)__ptr[lVar21 + 1].b;
        uVar16 = (uchar)iVar18;
        if (0xfe < iVar18) {
          uVar16 = 0xff;
        }
        __ptr[lVar21 + 1].b = uVar16;
      }
      iVar18 = image->height + -1;
      if (iVar6 < iVar18 && iVar13 != 0) {
        lVar19 = (long)(local_84 * iVar15 + iVar13);
        iVar22 = (int)(fVar23 * 3.0 * 0.0625) + (uint)__ptr[lVar19 + -1].r;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        __ptr[lVar19 + -1].r = (uchar)iVar22;
        iVar22 = (int)((float)iVar17 * 3.0 * 0.0625) + (uint)__ptr[lVar19 + -1].g;
        uVar16 = (uchar)iVar22;
        if (0xfe < iVar22) {
          uVar16 = 0xff;
        }
        __ptr[lVar19 + -1].g = uVar16;
        iVar22 = (int)((float)iVar8 * 3.0 * 0.0625) + (uint)__ptr[lVar19 + -1].b;
        uVar16 = (uchar)iVar22;
        if (0xfe < iVar22) {
          uVar16 = 0xff;
        }
        __ptr[lVar19 + -1].b = uVar16;
      }
      if (iVar6 < iVar18) {
        lVar19 = (long)(iVar15 * local_84 + iVar13);
        iVar18 = (int)(fVar23 * 5.0 * 0.0625) + (uint)__ptr[lVar19].r;
        if (0xfe < iVar18) {
          iVar18 = 0xff;
        }
        iVar22 = (int)((float)iVar17 * 5.0 * 0.0625) + (uint)__ptr[lVar19].g;
        if (0xfe < iVar22) {
          iVar22 = 0xff;
        }
        iVar20 = (int)((float)iVar8 * 5.0 * 0.0625) + (uint)__ptr[lVar19].b;
        if (0xfe < iVar20) {
          iVar20 = 0xff;
        }
        __ptr[lVar19].r = (uchar)iVar18;
        __ptr[lVar19].g = (uchar)iVar22;
        __ptr[lVar19].b = (uchar)iVar20;
        if (iVar13 < iVar15 + -1) {
          iVar15 = (int)(fVar23 * 0.0625) + (uint)__ptr[lVar19 + 1].r;
          uVar16 = (uchar)iVar15;
          if (0xfe < iVar15) {
            uVar16 = 0xff;
          }
          __ptr[lVar19 + 1].r = uVar16;
          iVar15 = (int)((float)iVar17 * 0.0625) + (uint)__ptr[lVar19 + 1].g;
          uVar16 = (uchar)iVar15;
          if (0xfe < iVar15) {
            uVar16 = 0xff;
          }
          __ptr[lVar19 + 1].g = uVar16;
          iVar15 = (int)((float)iVar8 * 0.0625) + (uint)__ptr[lVar19 + 1].b;
          uVar16 = (uchar)iVar15;
          if (0xfe < iVar15) {
            uVar16 = 0xff;
          }
          __ptr[lVar19 + 1].b = uVar16;
        }
      }
      *(ushort *)((long)image->data + lVar21 * 2) =
           (ushort)bVar4 << ((byte)aBpp & 0x1f) | (ushort)bVar5 |
           (ushort)bVar2 << (bVar7 & 0x1f) | (ushort)bVar3 << ((char)gBpp + bVar7 & 0x1f);
      iVar15 = image->width;
    }
    local_84 = local_84 + 1;
    iVar6 = iVar6 + 1;
    iVar13 = image->height;
  }
  free(__ptr);
  return;
}

Assistant:

void ImageDither(Image *image, int rBpp, int gBpp, int bBpp, int aBpp)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB)
    {
        TRACELOG(LOG_WARNING, "IMAGE: Compressed data formats can not be dithered");
        return;
    }

    if ((rBpp + gBpp + bBpp + aBpp) > 16)
    {
        TRACELOG(LOG_WARNING, "IMAGE: Unsupported dithering bpps (%ibpp), only 16bpp or lower modes supported", (rBpp+gBpp+bBpp+aBpp));
    }
    else
    {
        Color *pixels = LoadImageColors(*image);

        RL_FREE(image->data);      // free old image data

        if ((image->format != PIXELFORMAT_UNCOMPRESSED_R8G8B8) && (image->format != PIXELFORMAT_UNCOMPRESSED_R8G8B8A8))
        {
            TRACELOG(LOG_WARNING, "IMAGE: Format is already 16bpp or lower, dithering could have no effect");
        }

        // Define new image format, check if desired bpp match internal known format
        if ((rBpp == 5) && (gBpp == 6) && (bBpp == 5) && (aBpp == 0)) image->format = PIXELFORMAT_UNCOMPRESSED_R5G6B5;
        else if ((rBpp == 5) && (gBpp == 5) && (bBpp == 5) && (aBpp == 1)) image->format = PIXELFORMAT_UNCOMPRESSED_R5G5B5A1;
        else if ((rBpp == 4) && (gBpp == 4) && (bBpp == 4) && (aBpp == 4)) image->format = PIXELFORMAT_UNCOMPRESSED_R4G4B4A4;
        else
        {
            image->format = 0;
            TRACELOG(LOG_WARNING, "IMAGE: Unsupported dithered OpenGL internal format: %ibpp (R%iG%iB%iA%i)", (rBpp+gBpp+bBpp+aBpp), rBpp, gBpp, bBpp, aBpp);
        }

        // NOTE: We will store the dithered data as unsigned short (16bpp)
        image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

        Color oldPixel = WHITE;
        Color newPixel = WHITE;

        int rError, gError, bError;
        unsigned short rPixel, gPixel, bPixel, aPixel;   // Used for 16bit pixel composition

        #define MIN(a,b) (((a)<(b))?(a):(b))

        for (int y = 0; y < image->height; y++)
        {
            for (int x = 0; x < image->width; x++)
            {
                oldPixel = pixels[y*image->width + x];

                // NOTE: New pixel obtained by bits truncate, it would be better to round values (check ImageFormat())
                newPixel.r = oldPixel.r >> (8 - rBpp);     // R bits
                newPixel.g = oldPixel.g >> (8 - gBpp);     // G bits
                newPixel.b = oldPixel.b >> (8 - bBpp);     // B bits
                newPixel.a = oldPixel.a >> (8 - aBpp);     // A bits (not used on dithering)

                // NOTE: Error must be computed between new and old pixel but using same number of bits!
                // We want to know how much color precision we have lost...
                rError = (int)oldPixel.r - (int)(newPixel.r << (8 - rBpp));
                gError = (int)oldPixel.g - (int)(newPixel.g << (8 - gBpp));
                bError = (int)oldPixel.b - (int)(newPixel.b << (8 - bBpp));

                pixels[y*image->width + x] = newPixel;

                // NOTE: Some cases are out of the array and should be ignored
                if (x < (image->width - 1))
                {
                    pixels[y*image->width + x+1].r = MIN((int)pixels[y*image->width + x+1].r + (int)((float)rError*7.0f/16), 0xff);
                    pixels[y*image->width + x+1].g = MIN((int)pixels[y*image->width + x+1].g + (int)((float)gError*7.0f/16), 0xff);
                    pixels[y*image->width + x+1].b = MIN((int)pixels[y*image->width + x+1].b + (int)((float)bError*7.0f/16), 0xff);
                }

                if ((x > 0) && (y < (image->height - 1)))
                {
                    pixels[(y+1)*image->width + x-1].r = MIN((int)pixels[(y+1)*image->width + x-1].r + (int)((float)rError*3.0f/16), 0xff);
                    pixels[(y+1)*image->width + x-1].g = MIN((int)pixels[(y+1)*image->width + x-1].g + (int)((float)gError*3.0f/16), 0xff);
                    pixels[(y+1)*image->width + x-1].b = MIN((int)pixels[(y+1)*image->width + x-1].b + (int)((float)bError*3.0f/16), 0xff);
                }

                if (y < (image->height - 1))
                {
                    pixels[(y+1)*image->width + x].r = MIN((int)pixels[(y+1)*image->width + x].r + (int)((float)rError*5.0f/16), 0xff);
                    pixels[(y+1)*image->width + x].g = MIN((int)pixels[(y+1)*image->width + x].g + (int)((float)gError*5.0f/16), 0xff);
                    pixels[(y+1)*image->width + x].b = MIN((int)pixels[(y+1)*image->width + x].b + (int)((float)bError*5.0f/16), 0xff);
                }

                if ((x < (image->width - 1)) && (y < (image->height - 1)))
                {
                    pixels[(y+1)*image->width + x+1].r = MIN((int)pixels[(y+1)*image->width + x+1].r + (int)((float)rError*1.0f/16), 0xff);
                    pixels[(y+1)*image->width + x+1].g = MIN((int)pixels[(y+1)*image->width + x+1].g + (int)((float)gError*1.0f/16), 0xff);
                    pixels[(y+1)*image->width + x+1].b = MIN((int)pixels[(y+1)*image->width + x+1].b + (int)((float)bError*1.0f/16), 0xff);
                }

                rPixel = (unsigned short)newPixel.r;
                gPixel = (unsigned short)newPixel.g;
                bPixel = (unsigned short)newPixel.b;
                aPixel = (unsigned short)newPixel.a;

                ((unsigned short *)image->data)[y*image->width + x] = (rPixel << (gBpp + bBpp + aBpp)) | (gPixel << (bBpp + aBpp)) | (bPixel << aBpp) | aPixel;
            }
        }

        UnloadImageColors(pixels);
    }
}